

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
create_attr_block(exr_context_t ctxt,exr_attribute_t **attr,size_t dblocksize,int32_t data_len,
                 uint8_t **data_ptr,char *name,int32_t nlen,char *type,int32_t tlen)

{
  exr_result_t eVar1;
  ulong __n;
  exr_attribute_t *peVar2;
  ulong uVar3;
  size_t sVar4;
  exr_attribute_t *__dest;
  exr_attr_box2i_t *peVar6;
  long lVar7;
  long lVar8;
  ulong uVar5;
  
  uVar3 = 0x20;
  if (0 < nlen) {
    uVar3 = (ulong)(nlen + 0x21);
  }
  __n = (ulong)(tlen + 1);
  lVar8 = 0;
  uVar5 = 0;
  if (0 < tlen) {
    uVar5 = __n;
  }
  sVar4 = uVar5 + uVar3;
  if (dblocksize != 0) {
    uVar3 = (ulong)((uint)sVar4 & 7);
    lVar8 = 8 - uVar3;
    if (uVar3 == 0) {
      lVar8 = 0;
    }
    sVar4 = sVar4 + dblocksize + lVar8;
  }
  if (data_len < 1) {
    lVar7 = 0;
  }
  else {
    uVar3 = (ulong)((uint)sVar4 & 7);
    lVar7 = 8 - uVar3;
    if (uVar3 == 0) {
      lVar7 = 0;
    }
    sVar4 = (uint)data_len + sVar4 + lVar7;
  }
  peVar2 = (exr_attribute_t *)(*ctxt->alloc_fn)(sVar4);
  if (peVar2 != (exr_attribute_t *)0x0) {
    __dest = peVar2 + 1;
    peVar2->name_length = '\0';
    peVar2->type_name_length = '\0';
    peVar2->pad[0] = '\0';
    peVar2->pad[1] = '\0';
    peVar2->type = EXR_ATTR_UNKNOWN;
    (peVar2->field_6).d = 0.0;
    peVar2->name = (char *)0x0;
    peVar2->type_name = (char *)0x0;
    *attr = peVar2;
    if (0 < nlen) {
      memcpy(__dest,name,(ulong)(uint)nlen + 1);
      peVar2->name = (char *)__dest;
      peVar2->name_length = (uint8_t)nlen;
      __dest = (exr_attribute_t *)(__dest->pad + ((ulong)(uint)nlen - 0x11));
    }
    if (0 < tlen) {
      memcpy(__dest,type,__n);
      peVar2->type_name = (char *)__dest;
      peVar2->type_name_length = (uint8_t)tlen;
      __dest = (exr_attribute_t *)(__dest->pad + (__n - 0x12));
    }
    peVar6 = (exr_attr_box2i_t *)(__dest->pad + lVar8 + -0x12);
    if (dblocksize != 0) {
      (peVar2->field_6).box2i = peVar6;
      peVar6 = (exr_attr_box2i_t *)((long)&(peVar6->min).x + dblocksize);
    }
    if (data_ptr != (uint8_t **)0x0) {
      if (data_len < 1) {
        *data_ptr = (uint8_t *)0x0;
      }
      else {
        *data_ptr = (uint8_t *)((long)&(peVar6->min).x + lVar7);
      }
    }
    return 0;
  }
  eVar1 = (*ctxt->standard_error)(ctxt,1);
  return eVar1;
}

Assistant:

static exr_result_t
create_attr_block (
    exr_context_t     ctxt,
    exr_attribute_t** attr,
    size_t            dblocksize,
    int32_t           data_len,
    uint8_t**         data_ptr,
    const char*       name,
    int32_t           nlen,
    const char*       type,
    int32_t           tlen)
{
    size_t           alignpad1, alignpad2;
    size_t           attrblocksz = sizeof (exr_attribute_t);
    uint8_t*         ptr;
    exr_attribute_t* nattr;
    exr_attribute_t  nil = {0};
    // not all compilers have this :(
    //const size_t ptralign = _Alignof(void*);
    const size_t ptralign = 8;

    if (nlen > 0) attrblocksz += (size_t) (nlen + 1);
    if (tlen > 0) attrblocksz += (size_t) (tlen + 1);

    if (dblocksize > 0)
    {
        alignpad1 = ptralign - (attrblocksz % ptralign);
        if (alignpad1 == ptralign) alignpad1 = 0;
        attrblocksz += alignpad1;
        attrblocksz += dblocksize;
    }
    else
        alignpad1 = 0;

    if (data_len > 0)
    {
        /* align the extra data to a pointer */
        alignpad2 = ptralign - (attrblocksz % ptralign);
        if (alignpad2 == ptralign) alignpad2 = 0;
        attrblocksz += alignpad2;
        attrblocksz += (size_t) data_len;
    }
    else
        alignpad2 = 0;

    ptr = (uint8_t*) ctxt->alloc_fn (attrblocksz);
    if (!ptr) return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

    nattr  = (exr_attribute_t*) ptr;
    *nattr = nil;
    *attr  = nattr;
    ptr += sizeof (exr_attribute_t);
    if (nlen > 0)
    {
        memcpy (ptr, name, (size_t) (nlen + 1));
        nattr->name        = (char*) ptr;
        nattr->name_length = (uint8_t) nlen;

        ptr += nlen + 1;
    }
    if (tlen > 0)
    {
        memcpy (ptr, type, (size_t) (tlen + 1));
        nattr->type_name        = (char*) ptr;
        nattr->type_name_length = (uint8_t) tlen;

        ptr += tlen + 1;
    }
    ptr += alignpad1;
    if (dblocksize > 0)
    {
        nattr->rawptr = ptr;
        ptr += dblocksize;
    }
    if (data_ptr)
    {
        if (data_len > 0)
        {
            ptr += alignpad2;
            *data_ptr = ptr;
        }
        else
            *data_ptr = NULL;
    }
    return EXR_ERR_SUCCESS;
}